

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

peer_info * __thiscall
nuraft::raft_server::get_peer_info(peer_info *__return_storage_ptr__,raft_server *this,int32 srv_id)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator cVar2;
  uint64_t uVar3;
  unique_lock<std::recursive_mutex> guard;
  int32 local_2c;
  unique_lock<std::recursive_mutex> local_28;
  
  if (((this->leader_).super___atomic_base<int>._M_i == this->id_) && ((this->role_)._M_i == leader)
     ) {
    local_28._M_device = &this->lock_;
    local_28._M_owns = false;
    local_2c = srv_id;
    std::unique_lock<std::recursive_mutex>::lock(&local_28);
    local_28._M_owns = true;
    cVar2 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&local_2c);
    __return_storage_ptr__->id_ = -1;
    __return_storage_ptr__->last_log_idx_ = 0;
    __return_storage_ptr__->last_succ_resp_us_ = 0;
    if (cVar2.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      puVar1 = *(undefined8 **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                       ._M_cur + 0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)cVar2.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x18);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      __return_storage_ptr__->id_ = *(int32 *)*puVar1;
      __return_storage_ptr__->last_log_idx_ = puVar1[0xe];
      uVar3 = timer_helper::get_us((timer_helper *)(puVar1 + 0x28));
      __return_storage_ptr__->last_succ_resp_us_ = uVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  }
  else {
    __return_storage_ptr__->id_ = -1;
    __return_storage_ptr__->last_log_idx_ = 0;
    __return_storage_ptr__->last_succ_resp_us_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

raft_server::peer_info raft_server::get_peer_info(int32 srv_id) const {
    if (!is_leader()) return peer_info();

    recur_lock(lock_);
    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) return peer_info();

    peer_info ret;
    ptr<peer> pp = entry->second;
    ret.id_ = pp->get_id();
    ret.last_log_idx_ = pp->get_last_accepted_log_idx();
    ret.last_succ_resp_us_ = pp->get_resp_timer_us();
    return ret;
}